

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBegin_usingCDict_internal
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  uint uVar1;
  uint uVar2;
  size_t sVar4;
  int compressionLevel;
  ZSTD_CCtx_params cctxParams;
  undefined8 local_108;
  undefined8 uStack_100;
  uint local_f8;
  ZSTD_CCtx_params local_e0;
  unsigned_long_long uVar3;
  
  if (cdict == (ZSTD_CDict *)0x0) {
    return 0xffffffffffffffe0;
  }
  if ((((pledgedSrcSize < 0x20000) || (pledgedSrcSize == 0xffffffffffffffff)) ||
      (pledgedSrcSize < cdict->dictContentSize * 6)) ||
     (compressionLevel = cdict->compressionLevel, compressionLevel == 0)) {
    local_f8 = (cdict->matchState).cParams.targetLength;
    local_108._0_4_ = (cdict->matchState).cParams.chainLog;
    local_108._4_4_ = (cdict->matchState).cParams.hashLog;
    uStack_100._0_4_ = (cdict->matchState).cParams.searchLog;
    uStack_100._4_4_ = (cdict->matchState).cParams.minMatch;
    compressionLevel = cdict->compressionLevel;
    local_e0.format = (cdict->matchState).cParams.windowLog;
    local_e0.cParams.strategy = (cdict->matchState).cParams.strategy;
  }
  else {
    ZSTD_getCParams_internal
              ((ZSTD_compressionParameters *)&local_e0,compressionLevel,pledgedSrcSize,
               cdict->dictContentSize,ZSTD_cpm_unknown);
    local_108 = CONCAT44(local_e0.cParams.chainLog,local_e0.cParams.windowLog);
    uStack_100 = CONCAT44(local_e0.cParams.searchLog,local_e0.cParams.hashLog);
    local_f8 = local_e0.cParams.minMatch;
    local_e0.cParams.strategy = local_e0.cParams.targetLength;
  }
  memset(&local_e0,0,0xb0);
  local_e0.cParams.chainLog = (uint)local_108;
  local_e0.cParams.hashLog = (uint)((ulong)local_108 >> 0x20);
  local_e0.cParams.searchLog = (uint)uStack_100;
  local_e0.cParams.minMatch = (uint)((ulong)uStack_100 >> 0x20);
  local_e0.cParams.targetLength = local_f8;
  local_e0.cParams.windowLog = ZSTD_f_zstd1_magicless;
  local_e0.useRowMatchFinder = ZSTD_urm_enableRowMatchFinder - (local_e0.format < 0xf);
  if (local_e0.cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    local_e0.useRowMatchFinder = ZSTD_urm_disableRowMatchFinder;
  }
  if (pledgedSrcSize == 0xffffffffffffffff) {
    pledgedSrcSize = 0xffffffffffffffff;
    local_e0.cParams.windowLog = local_e0.format;
  }
  else {
    if (1 < pledgedSrcSize) {
      uVar3 = 0x80000;
      if (pledgedSrcSize < 0x80000) {
        uVar3 = pledgedSrcSize;
      }
      uVar2 = (int)uVar3 - 1;
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      local_e0.cParams.windowLog = (uVar1 ^ 0xffffffe0) + 0x21;
    }
    if (local_e0.cParams.windowLog < local_e0.format) {
      local_e0.cParams.windowLog = local_e0.format;
    }
  }
  local_e0.fParams._0_8_ = fParams._0_8_;
  local_e0.fParams.noDictIDFlag = fParams.noDictIDFlag;
  local_e0.compressionLevel = compressionLevel;
  sVar4 = ZSTD_compressBegin_internal
                    (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,&local_e0,pledgedSrcSize,
                     ZSTDb_not_buffered);
  return sVar4;
}

Assistant:

static size_t ZSTD_compressBegin_usingCDict_internal(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_internal");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong, "NULL pointer!");
    /* Initialize the cctxParams from the cdict */
    {
        ZSTD_parameters params;
        params.fParams = fParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 ) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, cdict->compressionLevel);
    }
    /* Increase window log to fit the entire dictionary and source if the
     * source size is known. Limit the increase to 19, which is the
     * window log for compression level 1 with the largest source size.
     */
    if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
        U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
        cctxParams.cParams.windowLog = MAX(cctxParams.cParams.windowLog, limitedSrcLog);
    }
    return ZSTD_compressBegin_internal(cctx,
                                        NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                        cdict,
                                        &cctxParams, pledgedSrcSize,
                                        ZSTDb_not_buffered);
}